

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

int resolve_amb_greedy(D_Parser *dp,int n,D_ParseNode **v)

{
  int iVar1;
  PNode *y;
  PNode *x;
  int iVar2;
  ulong uVar3;
  
  iVar2 = 0;
  if (1 < n) {
    iVar2 = 0;
    uVar3 = 1;
    do {
      x = (PNode *)(v[uVar3] + -2);
      if (v[uVar3] == (D_ParseNode *)0x0) {
        x = (PNode *)0x0;
      }
      y = (PNode *)(v[iVar2] + -2);
      if (v[iVar2] == (D_ParseNode *)0x0) {
        y = (PNode *)0x0;
      }
      iVar1 = cmp_greediness((Parser *)dp,x,y);
      if ((iVar1 < 0) ||
         ((iVar1 == 0 && (*(uint *)&v[uVar3][-2].start_loc.ws < *(uint *)&v[iVar2][-2].start_loc.ws)
          ))) {
        iVar2 = (int)uVar3;
      }
      uVar3 = uVar3 + 1;
    } while ((uint)n != uVar3);
  }
  return iVar2;
}

Assistant:

int resolve_amb_greedy(D_Parser *dp, int n, D_ParseNode **v) {
  int i, result, selected_node = 0;

  for (i = 1; i < n; i++) {
    result = cmp_greediness((Parser *)dp, D_ParseNode_to_PNode(v[i]), D_ParseNode_to_PNode(v[selected_node]));
    if (result < 0 ||
        (result == 0 && D_ParseNode_to_PNode(v[i])->height < D_ParseNode_to_PNode(v[selected_node])->height))
      selected_node = i;
  }
  return selected_node;
}